

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastAdderFast_int(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int Log2,int CarryIn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  size_t __nmemb;
  uint uVar8;
  long lVar9;
  int *local_80;
  long local_70;
  int Carry;
  
  uVar8 = 1 << ((byte)Log2 & 0x1f);
  __nmemb = (size_t)(int)(uVar8 + 1);
  __ptr = (int *)calloc(__nmemb,4);
  __ptr_00 = calloc(__nmemb,4);
  __ptr_01 = calloc(__nmemb,4);
  if (Log2 == 0) {
    Carry = CarryIn;
    Wlc_BlastFullAdder(pNew,*pAdd0,*pAdd1,CarryIn,&Carry,pAdd0);
    free(__ptr);
  }
  else {
    if ((int)uVar8 < 2) {
      __assert_fail("nBits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                    ,0x1bf,"void Wlc_BlastAdderFast_int(Gia_Man_t *, int *, int *, int, int)");
    }
    *__ptr = CarryIn;
    uVar5 = (ulong)uVar8;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = Gia_ManHashAnd(pNew,pAdd0[uVar6],pAdd1[uVar6]);
      __ptr[uVar6 + 1] = iVar1;
      iVar1 = Gia_ManHashXor(pNew,pAdd0[uVar6],pAdd1[uVar6]);
      *(int *)((long)__ptr_00 + uVar6 * 4 + 4) = iVar1;
      *(int *)((long)__ptr_01 + uVar6 * 4 + 4) = iVar1;
    }
    for (uVar6 = 1; uVar6 <= uVar5; uVar6 = uVar6 + 2) {
      iVar1 = __ptr[uVar6];
      iVar3 = *(int *)((long)__ptr_00 + uVar6 * 4);
      iVar2 = Gia_ManHashAnd(pNew,iVar3,__ptr[uVar6 - 1]);
      iVar1 = Gia_ManHashOr(pNew,iVar1,iVar2);
      iVar3 = Gia_ManHashAnd(pNew,iVar3,*(int *)((long)__ptr_00 + uVar6 * 4 + -4));
      *(int *)((long)__ptr_00 + uVar6 * 4) = iVar3;
      __ptr[uVar6] = iVar1;
    }
    local_80 = __ptr + -1;
    local_70 = (long)__ptr_00 + -4;
    uVar4 = 2;
    for (lVar7 = 1; lVar7 < Log2 + -1; lVar7 = lVar7 + 1) {
      for (lVar9 = (long)(int)(uVar4 | 1); lVar9 <= (long)uVar5; lVar9 = lVar9 + 2) {
        iVar1 = __ptr[lVar9];
        iVar3 = *(int *)((long)__ptr_00 + lVar9 * 4);
        iVar2 = Gia_ManHashAnd(pNew,iVar3,local_80[lVar9 + -1]);
        iVar1 = Gia_ManHashOr(pNew,iVar1,iVar2);
        iVar3 = Gia_ManHashAnd(pNew,iVar3,*(int *)(local_70 + -4 + lVar9 * 4));
        *(int *)((long)__ptr_00 + lVar9 * 4) = iVar3;
        __ptr[lVar9] = iVar1;
      }
      uVar4 = uVar4 + 2;
      local_80 = local_80 + -2;
      local_70 = local_70 + -8;
    }
    uVar6 = (ulong)(uVar8 >> 1);
    lVar7 = uVar6 * 4 + 4;
    for (lVar9 = 0; (ulong)((uVar8 >> 1) + 1) + lVar9 <= uVar5; lVar9 = lVar9 + 2) {
      iVar1 = __ptr[uVar6 + lVar9 + 1];
      iVar3 = *(int *)((long)__ptr_00 + lVar9 * 4 + lVar7);
      iVar2 = Gia_ManHashAnd(pNew,iVar3,__ptr[lVar9 + 1]);
      iVar1 = Gia_ManHashOr(pNew,iVar1,iVar2);
      iVar3 = Gia_ManHashAnd(pNew,iVar3,*(int *)((long)__ptr_00 + lVar9 * 4 + 4));
      *(int *)((long)__ptr_00 + lVar9 * 4 + lVar7) = iVar3;
      __ptr[uVar6 + lVar9 + 1] = iVar1;
    }
    for (uVar6 = 2; uVar6 <= uVar5; uVar6 = uVar6 + 2) {
      iVar1 = __ptr[uVar6];
      iVar3 = *(int *)((long)__ptr_00 + uVar6 * 4);
      iVar2 = Gia_ManHashAnd(pNew,iVar3,__ptr[uVar6 - 1]);
      iVar1 = Gia_ManHashOr(pNew,iVar1,iVar2);
      iVar3 = Gia_ManHashAnd(pNew,iVar3,*(int *)((long)__ptr_00 + uVar6 * 4 + -4));
      *(int *)((long)__ptr_00 + uVar6 * 4) = iVar3;
      __ptr[uVar6] = iVar1;
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = Gia_ManHashXor(pNew,*(int *)((long)__ptr_01 + uVar6 * 4 + 4),__ptr[uVar6]);
      pAdd0[uVar6] = iVar1;
    }
    pAdd0[uVar5] = __ptr[uVar5];
    free(__ptr);
  }
  free(__ptr_00);
  free(__ptr_01);
  return;
}

Assistant:

void Wlc_BlastAdderFast_int( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int Log2, int CarryIn ) // result is in pAdd0
{
    int i, b, Gen, Pro, nBits = 1 << Log2;
    int * pGen = ABC_CALLOC( int, nBits+1 );
    int * pPro = ABC_CALLOC( int, nBits+1 );
    int * pPro2= ABC_CALLOC( int, nBits+1 );
    if ( nBits == 1 )
    {
        int Carry = CarryIn;
        Wlc_BlastFullAdder( pNew, pAdd0[0], pAdd1[0], Carry, &Carry, &pAdd0[0] );
        ABC_FREE(pGen);
        ABC_FREE(pPro);
        ABC_FREE(pPro2);
        return;
    }
    assert( nBits >= 2 );
    pGen[0] = CarryIn;
    pPro[0] = 0;
    pPro2[0]= 0;
    for ( b = 1; b <= nBits; b++ )
    {
        pGen[b] = Gia_ManHashAnd(pNew, pAdd0[b-1], pAdd1[b-1]);
        pPro[b] = Gia_ManHashXor(pNew, pAdd0[b-1], pAdd1[b-1]);
        pPro2[b]= pPro[b];
    }
    
    // Han-Carlson adder from http://www.aoki.ecei.tohoku.ac.jp/arith/mg/algorithm.html
    for ( b = 1; b <= nBits; b += 2 )
    {
        Gen = Gia_ManHashOr( pNew, pGen[b], Gia_ManHashAnd(pNew, pPro[b], pGen[b-1]) );
        Pro = Gia_ManHashAnd(pNew, pPro[b], pPro[b-1]);
        pPro[b] = Pro;
        pGen[b] = Gen;
    }
    for ( i = 1; i < Log2-1; i++ )
    {
        for ( b = 1 + 2*i; b <= nBits; b += 2 )
        {
            Gen = Gia_ManHashOr( pNew, pGen[b], Gia_ManHashAnd(pNew, pPro[b], pGen[b-i*2]) );
            Pro = Gia_ManHashAnd(pNew, pPro[b], pPro[b-i*2]);
            pPro[b] = Pro;
            pGen[b] = Gen;
        }
    }
    for ( b = nBits/2 + 1; b <= nBits; b += 2 )
    {
        Gen = Gia_ManHashOr( pNew, pGen[b], Gia_ManHashAnd(pNew, pPro[b], pGen[b-nBits/2]) );
        Pro = Gia_ManHashAnd(pNew, pPro[b], pPro[b-nBits/2]);
        pPro[b] = Pro;
        pGen[b] = Gen;
    }
    for ( b = 2; b <= nBits; b += 2 )
    {
        Gen = Gia_ManHashOr( pNew, pGen[b], Gia_ManHashAnd(pNew, pPro[b], pGen[b-1]) );
        Pro = Gia_ManHashAnd(pNew, pPro[b], pPro[b-1]);
        pPro[b] = Pro;
        pGen[b] = Gen;
    }
    
    for ( b = 0; b < nBits; b++ )
        pAdd0[b] = Gia_ManHashXor(pNew, pPro2[b+1], pGen[b]);
    pAdd0[nBits] = pGen[nBits];

    ABC_FREE(pGen);
    ABC_FREE(pPro);
    ABC_FREE(pPro2);
}